

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)84>,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<174u,Fixpp::Type::String>,Fixpp::TagT<175u,Fixpp::Type::String>,Fixpp::TagT<176u,Fixpp::Type::String>,Fixpp::TagT<177u,Fixpp::Type::String>,Fixpp::TagT<178u,Fixpp::Type::String>,Fixpp::TagT<179u,Fixpp::Type::String>,Fixpp::TagT<180u,Fixpp::Type::String>,Fixpp::TagT<181u,Fixpp::Type::String>,Fixpp::TagT<182u,Fixpp::Type::String>,Fixpp::TagT<183u,Fixpp::Type::String>,Fixpp::TagT<184u,Fixpp::Type::String>,Fixpp::TagT<185u,Fixpp::Type::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>,Fixpp::TypedParsingContext<void>>
          (MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
           *this,Token *valueToken,TypedParsingContext<void> *message,undefined8 param_3,int tag)

{
  pair<const_char_*,_unsigned_long> local_48;
  int local_34;
  undefined8 uStack_30;
  int tag_local;
  TypedParsingContext<void> *param_3_local;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_T_>,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>
  *message_local;
  Token *valueToken_local;
  MessageVisitor<should_visit_incremental_refresh_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
  *this_local;
  
  local_34 = tag;
  uStack_30 = param_3;
  param_3_local = message;
  message_local =
       (VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_T_>,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>
        *)valueToken;
  valueToken_local = (Token *)this;
  local_48 = StreamCursor::Token::view(valueToken);
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<174u,Fixpp::Type::String>,Fixpp::TagT<175u,Fixpp::Type::String>,Fixpp::TagT<176u,Fixpp::Type::String>,Fixpp::TagT<177u,Fixpp::Type::String>,Fixpp::TagT<178u,Fixpp::Type::String>,Fixpp::TagT<179u,Fixpp::Type::String>,Fixpp::TagT<180u,Fixpp::Type::String>,Fixpp::TagT<181u,Fixpp::Type::String>,Fixpp::TagT<182u,Fixpp::Type::String>,Fixpp::TagT<183u,Fixpp::Type::String>,Fixpp::TagT<184u,Fixpp::Type::String>,Fixpp::TagT<185u,Fixpp::Type::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>::Unparsed>
  ::emplace_back<int&,std::pair<char_const*,unsigned_long>>
            ((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<174u,Fixpp::Type::String>,Fixpp::TagT<175u,Fixpp::Type::String>,Fixpp::TagT<176u,Fixpp::Type::String>,Fixpp::TagT<177u,Fixpp::Type::String>,Fixpp::TagT<178u,Fixpp::Type::String>,Fixpp::TagT<179u,Fixpp::Type::String>,Fixpp::TagT<180u,Fixpp::Type::String>,Fixpp::TagT<181u,Fixpp::Type::String>,Fixpp::TagT<182u,Fixpp::Type::String>,Fixpp::TagT<183u,Fixpp::Type::String>,Fixpp::TagT<184u,Fixpp::Type::String>,Fixpp::TagT<185u,Fixpp::Type::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>::Unparsed>
              *)(message[5].super_ParsingContext.error.storage_.__data + 0x18),&local_34,&local_48);
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }